

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanRegExpConstantNoAST
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,ArenaAllocator *alloc)

{
  ScriptContext *scriptContext;
  size_t sVar1;
  code *pcVar2;
  StandardChars<char16_t> *standardEncodedChars_00;
  bool bVar3;
  ThreadContext *pTVar4;
  StandardChars<char16_t> *standardChars_00;
  RegexPattern *pRVar5;
  undefined4 *puVar6;
  size_t sVar7;
  RegexPattern *pattern;
  ParseError e;
  undefined1 local_f8 [8];
  Parser<UTF8EncodingPolicyBase<false>,_true> parser;
  charcount_t bodyLen;
  charcount_t totalChars;
  charcount_t bodyChars;
  charcount_t totalLen;
  StandardChars<char16_t> *standardChars;
  StandardChars<unsigned_char> *standardEncodedChars;
  ThreadContext *threadContext;
  ArenaAllocator *alloc_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  threadContext = (ThreadContext *)alloc;
  alloc_local = (ArenaAllocator *)this;
  pTVar4 = Js::ScriptContext::GetThreadContext(this->m_scriptContext);
  ThreadContext::ProbeStackNoDispose(pTVar4,0x6000,this->m_scriptContext,(PVOID)0x0);
  standardEncodedChars =
       (StandardChars<unsigned_char> *)Js::ScriptContext::GetThreadContext(this->m_scriptContext);
  standardChars =
       (StandardChars<char16_t> *)
       ThreadContext::GetStandardChars((ThreadContext *)standardEncodedChars,(uint8 *)0x0);
  standardChars_00 =
       ThreadContext::GetStandardChars((ThreadContext *)standardEncodedChars,(char16 *)0x0);
  pTVar4 = threadContext;
  standardEncodedChars_00 = standardChars;
  totalChars = 0;
  bodyLen = 0;
  parser.deferredIfUnicodeError._4_4_ = 0;
  parser.deferredIfUnicodeError._0_4_ = 0;
  scriptContext = this->m_scriptContext;
  _bodyChars = standardChars_00;
  bVar3 = UTF8EncodingPolicyBase<false>::IsUtf8(&this->super_UTF8EncodingPolicyBase<false>);
  UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::Parser
            ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_f8,scriptContext,
             (ArenaAllocator *)pTVar4,(StandardChars<unsigned_char> *)standardEncodedChars_00,
             standardChars_00,bVar3,(DebugWriter *)0x0);
  UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::ParseLiteralNoAST
            ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_f8,this->m_currentCharacter,
             this->m_pchLast,(CharCount *)&parser.deferredIfUnicodeError,&totalChars,&bodyLen,
             (CharCount *)((long)&parser.deferredIfUnicodeError + 4));
  pRVar5 = UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::CompileProgram<false>
                     ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_f8,(Node *)0x0,
                      &this->m_currentCharacter,totalChars,bodyLen,
                      (CharCount)parser.deferredIfUnicodeError,parser.deferredIfUnicodeError._4_4_,
                      NoRegexFlags);
  if (pRVar5 != (RegexPattern *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x3af,"(pattern == nullptr)","pattern == nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  sVar1 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  sVar7 = UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::GetMultiUnits
                    ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_f8);
  UTF8EncodingPolicyBase<false>::RestoreMultiUnits
            (&this->super_UTF8EncodingPolicyBase<false>,sVar1 + sVar7);
  this->m_ptoken->tk = tkRegExp;
  return tkRegExp;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanRegExpConstantNoAST(ArenaAllocator* alloc)
{
    PROBE_STACK_NO_DISPOSE(m_scriptContext, Js::Constants::MinStackRegex);

    ThreadContext *threadContext = m_scriptContext->GetThreadContext();
    UnifiedRegex::StandardChars<EncodedChar>* standardEncodedChars = threadContext->GetStandardChars((EncodedChar*)0);
    UnifiedRegex::StandardChars<char16>* standardChars = threadContext->GetStandardChars((char16*)0);
    charcount_t totalLen = 0, bodyChars = 0, totalChars = 0, bodyLen = 0;
    UnifiedRegex::Parser<EncodingPolicy, true> parser
            ( m_scriptContext
            , alloc
            , standardEncodedChars
            , standardChars
            , this->IsUtf8()
#if ENABLE_REGEX_CONFIG_OPTIONS
            , 0
#endif
            );
    try
    {
        parser.ParseLiteralNoAST(m_currentCharacter, m_pchLast, bodyLen, totalLen, bodyChars, totalChars);
    }
    catch (UnifiedRegex::ParseError e)
    {
        m_currentCharacter += e.encodedPos;
        Error(e.error);
        // never reached
    }

    UnifiedRegex::RegexPattern* pattern = parser.template CompileProgram<false>(nullptr, m_currentCharacter, totalLen, bodyChars, bodyLen, totalChars, UnifiedRegex::NoRegexFlags);
    Assert(pattern == nullptr);  // BuildAST == false, CompileProgram should return nullptr
    this->RestoreMultiUnits(this->m_cMultiUnits + parser.GetMultiUnits()); // m_currentCharacter changed, sync MultiUnits

    return (m_ptoken->tk = tkRegExp);

}